

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_dec.c
# Opt level: O0

int ALPHDecode(VP8Decoder *dec,int row,int num_rows)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  uint8_t *__src;
  uint8_t *puVar4;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint8_t *dst;
  uint8_t *deltas;
  uint8_t *prev_line;
  int y;
  int height;
  int width;
  ALPHDecoder *alph_dec;
  uint8_t *local_48;
  undefined8 in_stack_ffffffffffffffc0;
  ALPHDecoder *in_stack_ffffffffffffffc8;
  uint8_t *puVar5;
  int local_2c;
  
  piVar2 = *(int **)(in_RDI + 0xb90);
  iVar3 = *piVar2;
  iVar1 = piVar2[0x29];
  if (piVar2[2] == 0) {
    __src = (uint8_t *)(*(long *)(in_RDI + 0xb98) + 1 + (long)(in_ESI * iVar3));
    puVar4 = (uint8_t *)(*(long *)(in_RDI + 3000) + (long)(in_ESI * iVar3));
    puVar5 = *(uint8_t **)(in_RDI + 0xbc0);
    if (piVar2[3] == 0) {
      for (local_2c = 0; local_48 = puVar4, local_2c < in_EDX; local_2c = local_2c + 1) {
        memcpy(local_48,__src,(long)iVar3);
        __src = __src + iVar3;
        puVar4 = local_48 + iVar3;
        puVar5 = local_48;
      }
    }
    else {
      for (local_2c = 0; local_48 = puVar4, local_2c < in_EDX; local_2c = local_2c + 1) {
        (*WebPUnfilters[(uint)piVar2[3]])(puVar5,__src,local_48,iVar3);
        __src = __src + iVar3;
        puVar4 = local_48 + iVar3;
        puVar5 = local_48;
      }
    }
    *(uint8_t **)(in_RDI + 0xbc0) = puVar5;
  }
  else {
    iVar3 = VP8LDecodeAlphaImageStream
                      (in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    if (iVar3 == 0) {
      return 0;
    }
  }
  if (iVar1 <= in_ESI + in_EDX) {
    *(undefined4 *)(in_RDI + 0xba8) = 1;
  }
  return 1;
}

Assistant:

static int ALPHDecode(VP8Decoder* const dec, int row, int num_rows) {
  ALPHDecoder* const alph_dec = dec->alph_dec_;
  const int width = alph_dec->width_;
  const int height = alph_dec->io_.crop_bottom;
  if (alph_dec->method_ == ALPHA_NO_COMPRESSION) {
    int y;
    const uint8_t* prev_line = dec->alpha_prev_line_;
    const uint8_t* deltas = dec->alpha_data_ + ALPHA_HEADER_LEN + row * width;
    uint8_t* dst = dec->alpha_plane_ + row * width;
    assert(deltas <= &dec->alpha_data_[dec->alpha_data_size_]);
    if (alph_dec->filter_ != WEBP_FILTER_NONE) {
      assert(WebPUnfilters[alph_dec->filter_] != NULL);
      for (y = 0; y < num_rows; ++y) {
        WebPUnfilters[alph_dec->filter_](prev_line, deltas, dst, width);
        prev_line = dst;
        dst += width;
        deltas += width;
      }
    } else {
      for (y = 0; y < num_rows; ++y) {
        memcpy(dst, deltas, width * sizeof(*dst));
        prev_line = dst;
        dst += width;
        deltas += width;
      }
    }
    dec->alpha_prev_line_ = prev_line;
  } else {  // alph_dec->method_ == ALPHA_LOSSLESS_COMPRESSION
    assert(alph_dec->vp8l_dec_ != NULL);
    if (!VP8LDecodeAlphaImageStream(alph_dec, row + num_rows)) {
      return 0;
    }
  }

  if (row + num_rows >= height) {
    dec->is_alpha_decoded_ = 1;
  }
  return 1;
}